

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_RW_nonblock.c
# Opt level: O2

int waitsocket(libssh2_socket_t socket_fd,LIBSSH2_SESSION *session)

{
  uint __i;
  int iVar1;
  long lVar2;
  ulong uVar3;
  fd_set *__writefds;
  fd_set *__readfds;
  timeval timeout;
  fd_set fd;
  
  timeout.tv_sec = 10;
  timeout.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fd.__fds_bits[lVar2] = 0;
  }
  fd.__fds_bits[socket_fd / 0x40] = fd.__fds_bits[socket_fd / 0x40] | 1L << ((byte)socket_fd & 0x3f)
  ;
  uVar3 = libssh2_session_block_directions(session);
  __readfds = &fd;
  if ((uVar3 & 1) == 0) {
    __readfds = (fd_set *)0x0;
  }
  __writefds = &fd;
  if ((uVar3 & 2) == 0) {
    __writefds = (fd_set *)0x0;
  }
  iVar1 = select(socket_fd + 1,(fd_set *)__readfds,(fd_set *)__writefds,(fd_set *)0x0,
                 (timeval *)&timeout);
  return iVar1;
}

Assistant:

static int waitsocket(libssh2_socket_t socket_fd, LIBSSH2_SESSION *session)
{
    struct timeval timeout;
    int rc;
    fd_set fd;
    fd_set *writefd = NULL;
    fd_set *readfd = NULL;
    int dir;

    timeout.tv_sec = 10;
    timeout.tv_usec = 0;

    FD_ZERO(&fd);

    FD_SET(socket_fd, &fd);

    /* now make sure we wait in the correct direction */
    dir = libssh2_session_block_directions(session);

    if(dir & LIBSSH2_SESSION_BLOCK_INBOUND)
        readfd = &fd;

    if(dir & LIBSSH2_SESSION_BLOCK_OUTBOUND)
        writefd = &fd;

    rc = select((int)(socket_fd + 1), readfd, writefd, NULL, &timeout);

    return rc;
}